

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::NumberStringBuilder::nextFieldPosition
          (NumberStringBuilder *this,FieldPosition *fp,UErrorCode *status)

{
  Field FVar1;
  int32_t iVar2;
  Field *pFVar3;
  Field local_44;
  int local_40;
  Field _field;
  int i;
  int32_t startIndex;
  int32_t fractionStart;
  bool seenStart;
  Field field;
  int32_t rawField;
  UErrorCode *status_local;
  FieldPosition *fp_local;
  NumberStringBuilder *this_local;
  
  FVar1 = FieldPosition::getField(fp);
  if (FVar1 == ~UNUM_INTEGER_FIELD) {
    this_local._7_1_ = false;
  }
  else if (((int)FVar1 < 0) || (10 < (int)FVar1)) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    i = -1;
    iVar2 = FieldPosition::getEndIndex(fp);
    for (local_40 = this->fZero + iVar2; local_40 <= this->fZero + this->fLength;
        local_40 = local_40 + 1) {
      local_44 = UNUM_FIELD_COUNT;
      if (local_40 < this->fZero + this->fLength) {
        pFVar3 = getFieldPtr(this);
        local_44 = pFVar3[local_40];
      }
      if ((this_local._7_1_ == false) || (FVar1 == local_44)) {
        if ((this_local._7_1_ == false) && (FVar1 == local_44)) {
          FieldPosition::setBeginIndex(fp,local_40 - this->fZero);
          this_local._7_1_ = true;
        }
        if ((local_44 == UNUM_INTEGER_FIELD) || (local_44 == UNUM_DECIMAL_SEPARATOR_FIELD)) {
          i = (local_40 - this->fZero) + 1;
        }
      }
      else if ((FVar1 != UNUM_INTEGER_FIELD) || (local_44 != UNUM_GROUPING_SEPARATOR_FIELD)) {
        FieldPosition::setEndIndex(fp,local_40 - this->fZero);
        break;
      }
    }
    if (((FVar1 == UNUM_FRACTION_FIELD) && (this_local._7_1_ == false)) && (i != -1)) {
      FieldPosition::setBeginIndex(fp,i);
      FieldPosition::setEndIndex(fp,i);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool NumberStringBuilder::nextFieldPosition(FieldPosition& fp, UErrorCode& status) const {
    int32_t rawField = fp.getField();

    if (rawField == FieldPosition::DONT_CARE) {
        return FALSE;
    }

    if (rawField < 0 || rawField >= UNUM_FIELD_COUNT) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }

    auto field = static_cast<Field>(rawField);

    bool seenStart = false;
    int32_t fractionStart = -1;
    int32_t startIndex = fp.getEndIndex();
    for (int i = fZero + startIndex; i <= fZero + fLength; i++) {
        Field _field = UNUM_FIELD_COUNT;
        if (i < fZero + fLength) {
            _field = getFieldPtr()[i];
        }
        if (seenStart && field != _field) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            if (field == UNUM_INTEGER_FIELD && _field == UNUM_GROUPING_SEPARATOR_FIELD) {
                continue;
            }
            fp.setEndIndex(i - fZero);
            break;
        } else if (!seenStart && field == _field) {
            fp.setBeginIndex(i - fZero);
            seenStart = true;
        }
        if (_field == UNUM_INTEGER_FIELD || _field == UNUM_DECIMAL_SEPARATOR_FIELD) {
            fractionStart = i - fZero + 1;
        }
    }

    // Backwards compatibility: FRACTION needs to start after INTEGER if empty.
    // Do not return that a field was found, though, since there is not actually a fraction part.
    if (field == UNUM_FRACTION_FIELD && !seenStart && fractionStart != -1) {
        fp.setBeginIndex(fractionStart);
        fp.setEndIndex(fractionStart);
    }

    return seenStart;
}